

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O2

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genAnnotations
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema schema)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader list;
  Schema scope;
  uint64_t id;
  Reader proto;
  Schema local_80;
  Reader local_78;
  Reader local_48;
  
  local_80.raw = schema.raw;
  Schema::getProto(&local_48,&local_80);
  capnp::schema::Node::Reader::getAnnotations(&local_78,&local_48);
  if (local_48._reader.dataSize < 0xc0) {
    id = 0;
  }
  else {
    id = *(uint64_t *)((long)local_48._reader.data + 0x10);
  }
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  scope = SchemaLoader::get(&this->schemaLoader,id,brand,(Schema)0x1d4ce0);
  list.reader.capTable = local_78.reader.capTable;
  list.reader.segment = local_78.reader.segment;
  list.reader.ptr = local_78.reader.ptr;
  list.reader.elementCount = local_78.reader.elementCount;
  list.reader.step = local_78.reader.step;
  list.reader.structDataSize = local_78.reader.structDataSize;
  list.reader.structPointerCount = local_78.reader.structPointerCount;
  list.reader.elementSize = local_78.reader.elementSize;
  list.reader._39_1_ = local_78.reader._39_1_;
  list.reader.nestingLimit = local_78.reader.nestingLimit;
  list.reader._44_4_ = local_78.reader._44_4_;
  genAnnotations(__return_storage_ptr__,this,list,scope);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree genAnnotations(Schema schema) {
    auto proto = schema.getProto();
    return genAnnotations(proto.getAnnotations(), schemaLoader.get(proto.getScopeId()));
  }